

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void analyzeTable(Parse *pParse,Table *pTab,Index *pOnlyIdx)

{
  int iStatCur_00;
  int iDb_00;
  int iStatCur;
  int iDb;
  Index *pOnlyIdx_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  iDb_00 = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
  sqlite3BeginWriteOperation(pParse,0,iDb_00);
  iStatCur_00 = pParse->nTab;
  pParse->nTab = pParse->nTab + 3;
  if (pOnlyIdx == (Index *)0x0) {
    openStatTable(pParse,iDb_00,iStatCur_00,pTab->zName,"tbl");
  }
  else {
    openStatTable(pParse,iDb_00,iStatCur_00,pOnlyIdx->zName,"idx");
  }
  analyzeOneTable(pParse,pTab,pOnlyIdx,iStatCur_00,pParse->nMem + 1,pParse->nTab);
  loadAnalysis(pParse,iDb_00);
  return;
}

Assistant:

static void analyzeTable(Parse *pParse, Table *pTab, Index *pOnlyIdx){
  int iDb;
  int iStatCur;

  assert( pTab!=0 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  sqlite3BeginWriteOperation(pParse, 0, iDb);
  iStatCur = pParse->nTab;
  pParse->nTab += 3;
  if( pOnlyIdx ){
    openStatTable(pParse, iDb, iStatCur, pOnlyIdx->zName, "idx");
  }else{
    openStatTable(pParse, iDb, iStatCur, pTab->zName, "tbl");
  }
  analyzeOneTable(pParse, pTab, pOnlyIdx, iStatCur,pParse->nMem+1,pParse->nTab);
  loadAnalysis(pParse, iDb);
}